

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superGate.c
# Opt level: O3

int Super_WriteCompare(Super_Gate_t_conflict **ppG1,Super_Gate_t_conflict **ppG2)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = (*ppG2)->uTruth[1];
  uVar3 = 0xffffffff;
  uVar2 = (*ppG1)->uTruth[1];
  if ((uVar1 <= uVar2) && (uVar3 = 1, uVar2 <= uVar1)) {
    uVar1 = (*ppG2)->uTruth[0];
    uVar3 = 0xffffffff;
    uVar2 = (*ppG1)->uTruth[0];
    if (uVar1 <= uVar2) {
      uVar3 = (uint)(uVar1 < uVar2);
    }
  }
  return uVar3;
}

Assistant:

int Super_WriteCompare( Super_Gate_t ** ppG1, Super_Gate_t ** ppG2 )
{
    unsigned * pTruth1 = (*ppG1)->uTruth;
    unsigned * pTruth2 = (*ppG2)->uTruth;
    if ( pTruth1[1] < pTruth2[1] )
        return -1;
    if ( pTruth1[1] > pTruth2[1] )
        return 1;
    if ( pTruth1[0] < pTruth2[0] )
        return -1;
    if ( pTruth1[0] > pTruth2[0] )
        return 1;
    return 0;
}